

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  unsigned_short uStack_26;
  RegSlot RStack_24;
  OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  RStack_24 = R1;
  layout._2_4_ = labelID;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>(&uStack_26,R1);
  if (bVar1) {
    stack0xffffffffffffffd6 = 6;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,
               (void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 6),6,&this->super_ByteCodeWriter,
               false);
    AddJumpOffset(this,op,layout._2_4_,6);
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg1(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1)
    {
        OpLayoutT_BrInt1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt1<SizePolicy>) - offsetof(OpLayoutT_BrInt1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }